

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-impl.cpp
# Opt level: O2

string * gguf_kv_to_str_abi_cxx11_(string *__return_storage_ptr__,gguf_context *ctx_gguf,int i)

{
  gguf_type gVar1;
  uint uVar2;
  char *pcVar3;
  void *data;
  ostream *poVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  allocator<char> local_242;
  allocator<char> local_241;
  void *local_240;
  string *local_238;
  long local_230;
  gguf_context *local_228;
  long local_220;
  string local_218;
  string local_1f8;
  string val;
  stringstream ss;
  ostream local_1a8 [376];
  
  lVar6 = (long)i;
  gVar1 = gguf_get_kv_type(ctx_gguf,lVar6);
  if (gVar1 == GGUF_TYPE_ARRAY) {
    gVar1 = gguf_get_arr_type(ctx_gguf,lVar6);
    uVar2 = gguf_get_arr_n(ctx_gguf,lVar6);
    if (gVar1 == GGUF_TYPE_STRING) {
      local_240 = (void *)0x0;
    }
    else {
      local_240 = (void *)gguf_get_arr_data(ctx_gguf,lVar6);
    }
    local_230 = lVar6;
    local_228 = ctx_gguf;
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::operator<<(local_1a8,"[");
    local_220 = (long)(int)(uVar2 - 1);
    uVar7 = 0;
    uVar5 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar5 = uVar7;
    }
    local_238 = __return_storage_ptr__;
    for (; uVar5 != uVar7; uVar7 = uVar7 + 1) {
      if (gVar1 == GGUF_TYPE_STRING) {
        pcVar3 = (char *)gguf_get_arr_str(local_228,local_230,uVar7);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&val,pcVar3,(allocator<char> *)&local_1f8);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"\\",&local_241);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"\\\\",&local_242);
        replace_all(&val,&local_1f8,&local_218);
        std::__cxx11::string::~string((string *)&local_218);
        std::__cxx11::string::~string((string *)&local_1f8);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"\"",&local_241);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"\\\"",&local_242);
        replace_all(&val,&local_1f8,&local_218);
        std::__cxx11::string::~string((string *)&local_218);
        std::__cxx11::string::~string((string *)&local_1f8);
        poVar4 = std::operator<<(local_1a8,'\"');
        poVar4 = std::operator<<(poVar4,(string *)&val);
        std::operator<<(poVar4,'\"');
LAB_001ef6ad:
        std::__cxx11::string::~string((string *)&val);
      }
      else {
        if (gVar1 != GGUF_TYPE_ARRAY) {
          gguf_data_to_str_abi_cxx11_(&val,gVar1,local_240,(int)uVar7);
          std::operator<<(local_1a8,(string *)&val);
          goto LAB_001ef6ad;
        }
        std::operator<<(local_1a8,"???");
      }
      if ((long)uVar7 < local_220) {
        std::operator<<(local_1a8,", ");
      }
    }
    std::operator<<(local_1a8,"]");
    __return_storage_ptr__ = local_238;
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  else if (gVar1 == GGUF_TYPE_STRING) {
    pcVar3 = (char *)gguf_get_val_str();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,pcVar3,(allocator<char> *)&ss);
  }
  else {
    data = (void *)gguf_get_val_data(ctx_gguf,lVar6);
    gguf_data_to_str_abi_cxx11_(__return_storage_ptr__,gVar1,data,0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string gguf_kv_to_str(const struct gguf_context * ctx_gguf, int i) {
    const enum gguf_type type = gguf_get_kv_type(ctx_gguf, i);

    switch (type) {
        case GGUF_TYPE_STRING:
            return gguf_get_val_str(ctx_gguf, i);
        case GGUF_TYPE_ARRAY:
            {
                const enum gguf_type arr_type = gguf_get_arr_type(ctx_gguf, i);
                int arr_n = gguf_get_arr_n(ctx_gguf, i);
                const void * data = arr_type == GGUF_TYPE_STRING ? nullptr : gguf_get_arr_data(ctx_gguf, i);
                std::stringstream ss;
                ss << "[";
                for (int j = 0; j < arr_n; j++) {
                    if (arr_type == GGUF_TYPE_STRING) {
                        std::string val = gguf_get_arr_str(ctx_gguf, i, j);
                        // escape quotes
                        replace_all(val, "\\", "\\\\");
                        replace_all(val, "\"", "\\\"");
                        ss << '"' << val << '"';
                    } else if (arr_type == GGUF_TYPE_ARRAY) {
                        ss << "???";
                    } else {
                        ss << gguf_data_to_str(arr_type, data, j);
                    }
                    if (j < arr_n - 1) {
                        ss << ", ";
                    }
                }
                ss << "]";
                return ss.str();
            }
        default:
            return gguf_data_to_str(type, gguf_get_val_data(ctx_gguf, i), 0);
    }
}